

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo-types.cpp
# Opt level: O2

void yactfr::internal::anon_unknown_23::validateNoMappedClkTypeId(PseudoDt *basePseudoDt)

{
  string msg;
  TextLocation loc;
  Set pseudoDts;
  undefined8 in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  undefined8 uVar1;
  undefined8 uVar2;
  string local_60 [32];
  _Hashtable<const_yactfr::internal::PseudoDt_*,_const_yactfr::internal::PseudoDt_*,_std::allocator<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Identity,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_40;
  
  uVar2 = 0;
  uVar1 = &stack0xffffffffffffff7f;
  findPseudoDts((Set *)&local_40,basePseudoDt,(PredFunc *)&stack0xffffffffffffff80);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffff80);
  if (local_40._M_element_count == 0) {
    std::
    _Hashtable<const_yactfr::internal::PseudoDt_*,_const_yactfr::internal::PseudoDt_*,_std::allocator<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Identity,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_40);
    return;
  }
  std::__cxx11::string::string
            (local_60,
             "At least one fixed-length unsigned integer type is mapped to a clock type; this isn\'t not supported within this scope."
             ,(allocator *)&stack0xffffffffffffff80);
  msg.field_2._8_8_ = in_stack_ffffffffffffff70;
  msg._0_24_ = basePseudoDt->_loc;
  loc._lineNumber = uVar1;
  loc._offset = in_stack_ffffffffffffff78;
  loc._colNumber = uVar2;
  throwTextParseError(msg,loc);
}

Assistant:

auto validateNoMappedClkTypeId(const PseudoDt& basePseudoDt)
{
    const auto pseudoDts = findPseudoUIntTypes(basePseudoDt, [](auto& pseudoIntType, auto) {
        if (!isFlUIntNotDtWrapper(pseudoIntType)) {
            return false;
        }

        return static_cast<const PseudoFlUIntType&>(pseudoIntType).mappedClkTypeId().has_value();
    });

    if (!pseudoDts.empty()) {
        throwTextParseError("At least one fixed-length unsigned integer type "
                            "is mapped to a clock type; "
                            "this isn't not supported within this scope.",
                            basePseudoDt.loc());
    }
}